

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# densehashtable.h
# Opt level: O0

pair<unsigned_long,_unsigned_long> __thiscall
google::
dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
::find_position<int>
          (dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *this,int *key)

{
  bool bVar1;
  size_type sVar2;
  pair<const_int,_int> *in_RSI;
  dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *in_RDI;
  size_type insert_pos;
  size_type bucknum;
  size_type bucket_count_minus_one;
  size_type num_probes;
  int *in_stack_ffffffffffffffa8;
  pair<const_int,_int> *a;
  undefined4 in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffbc;
  dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *this_00;
  dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
  *local_38;
  ulong local_30;
  long local_28;
  pair<const_int,_int> *local_20;
  pair<unsigned_long,_unsigned_long> local_10;
  
  local_28 = 0;
  local_20 = in_RSI;
  sVar2 = bucket_count(in_RDI);
  local_30 = sVar2 - 1;
  sVar2 = hash<int>(in_RDI,in_stack_ffffffffffffffa8);
  local_38 = (dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
              *)(sVar2 & local_30);
  this_00 = (dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
             *)0xffffffffffffffff;
  do {
    bVar1 = test_empty(this_00,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      if (this_00 ==
          (dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0xffffffffffffffff) {
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_10,
                   &dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                    ::ILLEGAL_BUCKET,(unsigned_long *)&local_38);
      }
      else {
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_10,
                   &dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                    ::ILLEGAL_BUCKET,(unsigned_long *)&stack0xffffffffffffffc0);
      }
      return local_10;
    }
    bVar1 = test_deleted(this_00,CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8));
    if (bVar1) {
      if (this_00 ==
          (dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
           *)0xffffffffffffffff) {
        this_00 = local_38;
      }
    }
    else {
      a = local_20;
      in_stack_ffffffffffffffbc =
           dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
           ::get_key<std::pair<int_const,int>&>(in_RDI,local_20);
      bVar1 = dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
              ::equals<int,int>(in_RDI,&a->first,(int *)0x1012507);
      if (bVar1) {
        std::pair<unsigned_long,_unsigned_long>::pair<unsigned_long_&,_true>
                  (&local_10,(unsigned_long *)&local_38,
                   &dense_hashtable<std::pair<int_const,int>,int_const,Hasher,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SelectKey,google::dense_hash_map<int_const,int,Hasher,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>::SetKey,Hasher,google::libc_allocator_with_realloc<std::pair<int_const,int>>>
                    ::ILLEGAL_BUCKET);
        return local_10;
      }
    }
    local_28 = local_28 + 1;
    local_38 = (dense_hashtable<std::pair<const_int,_int>,_const_int,_Hasher,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SelectKey,_google::dense_hash_map<const_int,_int,_Hasher,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>::SetKey,_Hasher,_google::libc_allocator_with_realloc<std::pair<const_int,_int>_>_>
                *)((long)&(local_38->settings).
                          super_sh_hashtable_settings<const_int,_Hasher,_unsigned_long,_4>.
                          super_Hasher.id_ + local_28 & local_30);
  } while( true );
}

Assistant:

std::pair<size_type, size_type> find_position(const K& key) const {
    size_type num_probes = 0;  // how many times we've probed
    const size_type bucket_count_minus_one = bucket_count() - 1;
    size_type bucknum = hash(key) & bucket_count_minus_one;
    size_type insert_pos = ILLEGAL_BUCKET;  // where we would insert
    while (1) {                             // probe until something happens
      if (test_empty(bucknum)) {            // bucket is empty
        if (insert_pos == ILLEGAL_BUCKET)   // found no prior place to insert
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, bucknum);
        else
          return std::pair<size_type, size_type>(ILLEGAL_BUCKET, insert_pos);

      } else if (test_deleted(bucknum)) {  // keep searching, but mark to insert
        if (insert_pos == ILLEGAL_BUCKET) insert_pos = bucknum;

      } else if (equals(key, get_key(table[bucknum]))) {
        return std::pair<size_type, size_type>(bucknum, ILLEGAL_BUCKET);
      }
      ++num_probes;  // we're doing another probe
      bucknum = (bucknum + JUMP_(key, num_probes)) & bucket_count_minus_one;
      assert(num_probes < bucket_count() &&
             "Hashtable is full: an error in key_equal<> or hash<>");
    }
  }